

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

void __thiscall blc::math::Float::align(Float *this)

{
  bool bVar1;
  Float *this_local;
  
  if ((1.0 < this->_nb) || (this->_nb <= -1.0 && this->_nb != -1.0)) {
    while( true ) {
      bVar1 = true;
      if (this->_nb < 10.0) {
        bVar1 = this->_nb <= -10.0;
      }
      if (!bVar1) break;
      this->_E = this->_E + 1;
      this->_nb = this->_nb / 10.0;
    }
  }
  else {
    while( true ) {
      bVar1 = false;
      if (this->_nb <= 1.0 && this->_nb != 1.0) {
        bVar1 = -1.0 < this->_nb;
      }
      if (!bVar1) break;
      this->_E = this->_E + -1;
      this->_nb = this->_nb * 10.0;
    }
  }
  return;
}

Assistant:

void blc::math::Float::align() {
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}